

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O1

void __thiscall
Imf_3_4::ChannelList::channelsInLayer
          (ChannelList *this,string *layerName,ConstIterator *first,ConstIterator *last)

{
  pointer pcVar1;
  long *plVar2;
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  pcVar1 = (layerName->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + layerName->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_48,local_40,0,'\x01');
  plVar2 = local_48;
  channelsWithPrefix(this,(char *)local_48,first,last);
  if (plVar2 != local_38) {
    operator_delete(plVar2,local_38[0] + 1);
  }
  return;
}

Assistant:

void
ChannelList::channelsInLayer (
    const string& layerName, ConstIterator& first, ConstIterator& last) const
{
    channelsWithPrefix (layerName + '.', first, last);
}